

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SuperCardPro.cpp
# Opt level: O2

bool __thiscall
SuperCardPro::SendCmd(SuperCardPro *this,uint8_t cmd,void *buf,int len,void *bulkbuf,int bulklen)

{
  bool bVar1;
  ulong uVar2;
  exception *this_00;
  ulong uVar3;
  size_t __n;
  char cVar4;
  uint8_t result [2];
  Data data;
  
  uVar2 = 0;
  uVar3 = 0;
  if (0 < len) {
    uVar3 = (ulong)(uint)len;
  }
  cVar4 = 'J';
  for (; uVar3 != uVar2; uVar2 = uVar2 + 1) {
    cVar4 = cVar4 + *(char *)((long)buf + uVar2);
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&data.super_vector<unsigned_char,_std::allocator<unsigned_char>_>,(long)(len + 3),
             (allocator_type *)result);
  *data.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data
   ._M_start = cmd;
  data.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start[1] = (uchar)len;
  if (len == 0) {
    __n = 0;
  }
  else {
    __n = (size_t)len;
    memcpy(data.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start + 2,buf,__n);
  }
  data.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start[__n + 2] =
       cVar4 + *data.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start +
       data.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start[1];
  bVar1 = WriteExact(this,data.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                     (int)data.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                     (int)data.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  if (bVar1) {
    if (cmd == 0xa9) {
      bVar1 = ReadExact(this,bulkbuf,bulklen);
LAB_00176967:
      if (bVar1 == false) goto LAB_00176995;
    }
    else if (cmd == 0xaa) {
      bVar1 = WriteExact(this,bulkbuf,bulklen);
      goto LAB_00176967;
    }
    bVar1 = ReadExact(this,result,2);
    if (bVar1) {
      if (result[0] != cmd) {
        this_00 = (exception *)__cxa_allocate_exception(0x10);
        util::exception::exception<char_const(&)[28]>
                  (this_00,(char (*) [28])"SCP result command mismatch");
        __cxa_throw(this_00,&util::exception::typeinfo,std::runtime_error::~runtime_error);
      }
      bVar1 = result[1] == 'O';
      this->m_error = result[1];
      goto LAB_00176997;
    }
  }
LAB_00176995:
  bVar1 = false;
LAB_00176997:
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&data);
  return bVar1;
}

Assistant:

bool SuperCardPro::SendCmd(uint8_t cmd, void* buf, int len, void* bulkbuf, int bulklen)
{
    auto p = reinterpret_cast<uint8_t*>(buf);
    uint8_t datasum = CHECKSUM_INIT;
    for (auto i = 0; i < len; ++i)
        datasum += p[i];

    Data data(2 + len + 1);
    data[0] = cmd;
    data[1] = static_cast<uint8_t>(len);
    if (len) memcpy(&data[2], buf, len);
    data[2 + len] = data[0] + data[1] + datasum;

    if (!WriteExact(&data[0], data.size()))
        return false;

    if (cmd == CMD_LOADRAM_USB && !WriteExact(bulkbuf, bulklen))
        return false;
    else if (cmd == CMD_SENDRAM_USB && !ReadExact(bulkbuf, bulklen))
        return false;

    uint8_t result[2];
    if (!ReadExact(result, sizeof(result)))
        return false;

    if (result[0] != cmd)
        throw util::exception("SCP result command mismatch");

    if (result[1] != pr_Ok)
    {
        m_error = result[1];
        return false;
    }

    m_error = result[1];    // pr_Ok
    return true;
}